

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_CopyObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR phNewObject)

{
  SessionObjectStore *this_00;
  HandleManager *this_01;
  char cVar1;
  byte isPrivateObject;
  bool bVar2;
  char extraout_AL;
  int iVar3;
  Session *this_02;
  Slot *this_03;
  Token *this_04;
  long *plVar4;
  CK_STATE CVar5;
  unsigned_long *puVar6;
  SessionObject *object;
  ByteString *pBVar7;
  size_t sVar8;
  long lVar9;
  _func_int **pp_Var10;
  CK_SLOT_ID CVar11;
  CK_OBJECT_HANDLE CVar12;
  CK_ULONG CVar13;
  CK_RV CVar14;
  byte isPrivateObject_00;
  ByteString value;
  P11Object *newp11object;
  CK_BBOOL local_1d1;
  ByteString local_198;
  OSAttribute local_170;
  OSAttribute local_d0;
  
  CVar14 = 400;
  if ((this->isInitialised == true) &&
     (CVar14 = 7, phNewObject != (CK_OBJECT_HANDLE_PTR)0x0 && pTemplate != (CK_ATTRIBUTE_PTR)0x0)) {
    *phNewObject = 0;
    this_02 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_02 == (Session *)0x0) {
      CVar14 = 0xb3;
    }
    else {
      this_03 = Session::getSlot(this_02);
      CVar14 = 5;
      if ((this_03 != (Slot *)0x0) &&
         (this_04 = Session::getToken(this_02), this_04 != (Token *)0x0)) {
        plVar4 = (long *)HandleManager::getObject(this->handleManager,hObject);
        CVar14 = 0x82;
        if ((plVar4 != (long *)0x0) &&
           (cVar1 = (**(code **)(*plVar4 + 0x50))(plVar4), cVar1 != '\0')) {
          local_1d1 = (**(code **)(*plVar4 + 0x20))(plVar4,1,0);
          isPrivateObject = (**(code **)(*plVar4 + 0x20))(plVar4,2,1);
          CVar5 = Session::getState(this_02);
          CVar14 = haveRead(CVar5,local_1d1,isPrivateObject);
          if (CVar14 == 0) {
            cVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,0x171,1);
            if (cVar1 == '\0') {
              return 0x1b;
            }
            isPrivateObject_00 = isPrivateObject;
            if (ulCount != 0) {
              puVar6 = &pTemplate->ulValueLen;
              CVar13 = ulCount;
              do {
                if (((_CK_ATTRIBUTE *)(puVar6 + -2))->type == 2) {
                  if (*puVar6 == 1) {
                    isPrivateObject_00 = *(byte *)puVar6[-1];
                  }
                }
                else if ((((_CK_ATTRIBUTE *)(puVar6 + -2))->type == 1) && (*puVar6 == 1)) {
                  local_1d1 = *(CK_BBOOL *)puVar6[-1];
                }
                puVar6 = puVar6 + 3;
                CVar13 = CVar13 - 1;
              } while (CVar13 != 0);
            }
            if (((isPrivateObject ^ 1) == 0) && (isPrivateObject_00 == 0)) {
              return 0xd1;
            }
            CVar5 = Session::getState(this_02);
            CVar14 = haveWrite(CVar5,local_1d1,isPrivateObject_00);
            if (CVar14 == 0) {
              if (local_1d1 == '\0') {
                this_00 = this->sessionObjectStore;
                CVar11 = Slot::getSlotID(this_03);
                object = SessionObjectStore::createObject
                                   (this_00,CVar11,hSession,isPrivateObject_00 != 0);
              }
              else {
                object = (SessionObject *)Token::createObject(this_04);
              }
              if (object == (SessionObject *)0x0) {
                return 5;
              }
              iVar3 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object,1);
              if ((char)iVar3 == '\0') {
                pp_Var10 = (object->super_OSObject)._vptr_OSObject;
              }
              else {
                lVar9 = 0;
                do {
                  cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4,lVar9);
                  if (cVar1 == '\0') {
LAB_0012eac2:
                    (*(object->super_OSObject)._vptr_OSObject[0xd])(object);
                    goto LAB_0012ead1;
                  }
                  (**(code **)(*plVar4 + 0x18))(&local_170,plVar4,lVar9);
                  if ((((isPrivateObject ^ 1) & isPrivateObject_00 != 0) == 0) ||
                     (bVar2 = OSAttribute::isByteStringAttribute(&local_170), !bVar2)) {
LAB_0012ea30:
                    iVar3 = (*(object->super_OSObject)._vptr_OSObject[8])(object,lVar9,&local_170);
                    if ((char)iVar3 == '\0') {
LAB_0012eab8:
                      OSAttribute::~OSAttribute(&local_170);
                      goto LAB_0012eac2;
                    }
                  }
                  else {
                    pBVar7 = OSAttribute::getByteStringValue(&local_170);
                    sVar8 = ByteString::size(pBVar7);
                    if (sVar8 == 0) goto LAB_0012ea30;
                    ByteString::ByteString(&local_198);
                    pBVar7 = OSAttribute::getByteStringValue(&local_170);
                    Token::encrypt(this_04,(char *)pBVar7,(int)&local_198);
                    if (extraout_AL == '\0') {
LAB_0012eaa4:
                      local_198._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_198.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                      goto LAB_0012eab8;
                    }
                    OSAttribute::OSAttribute(&local_d0,&local_198);
                    iVar3 = (*(object->super_OSObject)._vptr_OSObject[8])(object,lVar9,&local_d0);
                    OSAttribute::~OSAttribute(&local_d0);
                    if ((char)iVar3 == '\0') goto LAB_0012eaa4;
                    local_198._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                              (&local_198.byteString.
                                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  }
                  lVar9 = (**(code **)(*plVar4 + 0x38))(plVar4,lVar9);
                  OSAttribute::~OSAttribute(&local_170);
                } while (lVar9 != 0);
                iVar3 = (*(object->super_OSObject)._vptr_OSObject[0xc])(object);
                if ((char)iVar3 != '\0') {
                  local_170._vptr_OSAttribute = (_func_int **)0x0;
                  CVar14 = newP11Object(&object->super_OSObject,(P11Object **)&local_170);
                  pp_Var10 = local_170._vptr_OSAttribute;
                  if (CVar14 == 0) {
                    CVar14 = P11Object::saveTemplate
                                       ((P11Object *)local_170._vptr_OSAttribute,this_04,
                                        isPrivateObject_00 != 0,pTemplate,ulCount,1);
                    (*(*(_func_int ***)pp_Var10)[1])(pp_Var10);
                    if (CVar14 == 0) {
                      this_01 = this->handleManager;
                      CVar11 = Slot::getSlotID(this_03);
                      if (local_1d1 == '\0') {
                        CVar12 = HandleManager::addSessionObject
                                           (this_01,CVar11,hSession,isPrivateObject_00 != 0,object);
                      }
                      else {
                        CVar12 = HandleManager::addTokenObject
                                           (this_01,CVar11,isPrivateObject_00 != 0,object);
                      }
                      *phNewObject = CVar12;
                      return 0;
                    }
                  }
                  (*(object->super_OSObject)._vptr_OSObject[0xe])();
                  return CVar14;
                }
LAB_0012ead1:
                pp_Var10 = (object->super_OSObject)._vptr_OSObject;
              }
              (*pp_Var10[0xe])(object);
              return 6;
            }
            if (CVar14 == 0xb5) {
              softHSMLog(6,"C_CopyObject",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x67c,"Session is read-only");
              return 0xb5;
            }
            if (CVar14 != 0x101) {
              return CVar14;
            }
            iVar3 = 0x67a;
          }
          else {
            if (CVar14 != 0x101) {
              return CVar14;
            }
            iVar3 = 0x657;
          }
          softHSMLog(6,"C_CopyObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,iVar3,"User is not authorized");
          CVar14 = 0x101;
        }
      }
    }
  }
  return CVar14;
}

Assistant:

CK_RV SoftHSM::C_CopyObject(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phNewObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phNewObject == NULL_PTR) return CKR_ARGUMENTS_BAD;
	*phNewObject = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL wasOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL wasPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), wasOnToken, wasPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if the object is copyable
	CK_BBOOL isCopyable = object->getBooleanValue(CKA_COPYABLE, true);
	if (!isCopyable) return CKR_ACTION_PROHIBITED;

	// Extract critical information from the template
	CK_BBOOL isOnToken = wasOnToken;
	CK_BBOOL isPrivate = wasPrivate;

	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		if ((pTemplate[i].type == CKA_TOKEN) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
		if ((pTemplate[i].type == CKA_PRIVATE) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
	}

	// Check privacy does not downgrade
	if (wasPrivate && !isPrivate) return CKR_TEMPLATE_INCONSISTENT;

	// Check write user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Create the object in session or on the token
	OSObject *newobject = NULL_PTR;
	if (isOnToken)
	{
		newobject = (OSObject*) token->createObject();
	}
	else
	{
		newobject = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}
	if (newobject == NULL) return CKR_GENERAL_ERROR;

	// Copy attributes from object class (CKA_CLASS=0 so the first)
	if (!newobject->startTransaction())
	{
		newobject->destroyObject();
		return CKR_FUNCTION_FAILED;
	}

	CK_ATTRIBUTE_TYPE attrType = CKA_CLASS;
	do
	{
		if (!object->attributeExists(attrType))
		{
			rv = CKR_FUNCTION_FAILED;
			break;
		}

		OSAttribute attr = object->getAttribute(attrType);

		// Upgrade privacy has to encrypt byte strings
		if (!wasPrivate && isPrivate &&
		    attr.isByteStringAttribute() &&
		    attr.getByteStringValue().size() != 0)
		{
			ByteString value;
			if (!token->encrypt(attr.getByteStringValue(), value) ||
			    !newobject->setAttribute(attrType, value))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		else
		{
			if (!newobject->setAttribute(attrType, attr))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		attrType = object->nextAttributeType(attrType);
	}
	while (attrType != CKA_CLASS);

	if (rv != CKR_OK)
	{
		newobject->abortTransaction();
	}
	else if (!newobject->commitTransaction())
	{
		rv = CKR_FUNCTION_FAILED;
	}

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Get the new P11 object
	P11Object* newp11object = NULL;
	rv = newP11Object(newobject,&newp11object);
	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Apply the template
	rv = newp11object->saveTemplate(token, isPrivate != CK_FALSE, pTemplate, ulCount, OBJECT_OP_COPY);
	delete newp11object;

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Set handle
	if (isOnToken)
	{
		*phNewObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, newobject);
	}
	else
	{
		*phNewObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, newobject);
	}

	return CKR_OK;
}